

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
VectorInstance::op_insert_beforeIndex
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  size_type sVar2;
  undefined8 *puVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  __normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  *this_00;
  int index;
  shared_ptr<Instance> instance;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_fffffffffffffef8;
  allocator *paVar4;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  *in_stack_ffffffffffffff08;
  allocator local_c1;
  shared_ptr<Instance> *local_c0;
  string *in_stack_ffffffffffffff48;
  IntegerInstance *in_stack_ffffffffffffff50;
  __weak_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffff90;
  const_iterator in_stack_ffffffffffffff98;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 2) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,0);
  get_shared_instance(in_stack_ffffffffffffff88,(string *)in_stack_ffffffffffffff80._M_pi);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,1);
  IntegerInstance::IntegerInstance(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  iVar1 = IntegerInstance::value((IntegerInstance *)&stack0xffffffffffffff70);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1c0b60);
  if (-1 < iVar1) {
    sVar2 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
            size((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 (in_RSI + 0x78));
    if (iVar1 <= (int)sVar2) {
      this_00 = (__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                 *)(in_RSI + 0x78);
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                (in_stack_fffffffffffffef8);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
      ::operator+(in_stack_ffffffffffffff08,(difference_type)this_00);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>const*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>
      ::__normal_iterator<std::shared_ptr<Instance>*>
                (this_00,(__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                          *)in_stack_fffffffffffffef8);
      local_c0 = (shared_ptr<Instance> *)
                 std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ::insert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                          (value_type *)in_stack_ffffffffffffff88);
      paVar4 = &local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"null",paVar4);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c0c7a);
      return in_RDI;
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_insert_beforeIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    int index = IntegerInstance(arguments[1]).value();
    if (index < 0 || index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    _value.insert(_value.begin() + index, instance);
    return "null";
}